

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

int __thiscall flatbuffers::FlatCompiler::Compile(FlatCompiler *this,FlatCOptions *options)

{
  string *filepath;
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  _Alloc_hider binary_schema;
  ulong binary_schema_size;
  shared_ptr<flatbuffers::CodeGenerator> *code_generator;
  pointer psVar5;
  string schema_contents;
  string ext;
  unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> parser;
  IDLOptions binary_opts;
  Parser conform_parser;
  string local_12a0;
  string local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  undefined1 local_1240 [456];
  FlatBufferBuilderImpl<false> local_1078 [11];
  IDLOptions local_ac0;
  Parser local_7b0;
  
  GetConformParser(&local_7b0,this,options);
  if ((options->annotate_schema)._M_string_length == 0) {
    if (((options->generators).
         super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (options->generators).
         super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((options->conform_to_schema)._M_string_length == 0)) {
      local_1240._0_8_ = local_1240 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1240,"No generator registered","");
      (*(this->params_).error_fn)(this,(string *)local_1240,true,true);
      if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
        operator_delete((void *)local_1240._0_8_,local_1240._16_8_ + 1);
      }
      iVar4 = -1;
      goto LAB_002fcafa;
    }
    GenerateCode((FlatCompiler *)local_1240,(FlatCOptions *)this,(Parser *)options);
    psVar5 = (options->generators).
             super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (options->generators).
             super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar5 != psVar1) {
      do {
        iVar4 = (*((psVar5->
                   super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->_vptr_CodeGenerator[10])();
        if ((char)iVar4 != '\0') {
          peVar2 = (psVar5->
                   super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          (*peVar2->_vptr_CodeGenerator[7])(peVar2,local_1240._0_8_,&options->output_path);
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != psVar1);
    }
    std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::~unique_ptr
              ((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
               local_1240);
  }
  else {
    filepath = &options->annotate_schema;
    GetExtension(&local_1280,filepath);
    iVar4 = std::__cxx11::string::compare((char *)&local_1280);
    if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_1280), iVar4 != 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240
                     ,"Expected a `.bfbs` or `.fbs` schema, got: ",filepath);
      (*(this->params_).error_fn)(this,(string *)local_1240,true,true);
      if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
        operator_delete((void *)local_1240._0_8_,local_1240._16_8_ + 1);
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_1280);
    local_12a0._M_dataplus._M_p = (pointer)&local_12a0.field_2;
    local_12a0._M_string_length = 0;
    local_12a0.field_2._M_local_buf[0] = '\0';
    bVar3 = LoadFile((filepath->_M_dataplus)._M_p,iVar4 == 0,&local_12a0);
    if (!bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240
                     ,"unable to load schema: ",filepath);
      (*(this->params_).error_fn)(this,(string *)local_1240,true,true);
      if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
        operator_delete((void *)local_1240._0_8_,local_1240._16_8_ + 1);
      }
    }
    IDLOptions::IDLOptions(&local_ac0);
    local_ac0.lang_to_generate._1_1_ = local_ac0.lang_to_generate._1_1_ | 1;
    Parser::Parser((Parser *)local_1240,&local_ac0);
    binary_schema._M_p = local_12a0._M_dataplus._M_p;
    binary_schema_size = local_12a0._M_string_length;
    if (iVar4 != 0) {
      ParseFile(this,(Parser *)local_1240,filepath,&local_12a0,&options->include_directories);
      Parser::Serialize((Parser *)local_1240);
      binary_schema._M_p = (pointer)FlatBufferBuilderImpl<false>::GetBufferPointer(local_1078);
      binary_schema_size = (ulong)local_1078[0].buf_.size_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)binary_schema._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 || binary_schema_size == 0) {
      std::operator+(&local_1260,"could not parse a value binary schema from: ",filepath);
      (*(this->params_).error_fn)(this,&local_1260,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
        operator_delete(local_1260._M_dataplus._M_p,local_1260.field_2._M_allocated_capacity + 1);
      }
    }
    AnnotateBinaries(this,(uint8_t *)binary_schema._M_p,binary_schema_size,options);
    Parser::~Parser((Parser *)local_1240);
    IDLOptions::~IDLOptions(&local_ac0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12a0._M_dataplus._M_p != &local_12a0.field_2) {
      operator_delete(local_12a0._M_dataplus._M_p,
                      CONCAT71(local_12a0.field_2._M_allocated_capacity._1_7_,
                               local_12a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
      operator_delete(local_1280._M_dataplus._M_p,local_1280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = 0;
LAB_002fcafa:
  Parser::~Parser(&local_7b0);
  return iVar4;
}

Assistant:

int FlatCompiler::Compile(const FlatCOptions &options) {
  // TODO(derekbailey): change to std::optional<Parser>
  Parser conform_parser = GetConformParser(options);

  // TODO(derekbailey): split to own method.
  if (!options.annotate_schema.empty()) {
    const std::string ext = flatbuffers::GetExtension(options.annotate_schema);
    if (!(ext == reflection::SchemaExtension() || ext == "fbs")) {
      Error("Expected a `.bfbs` or `.fbs` schema, got: " +
            options.annotate_schema);
    }

    const bool is_binary_schema = ext == reflection::SchemaExtension();

    std::string schema_contents;
    if (!flatbuffers::LoadFile(options.annotate_schema.c_str(),
                               /*binary=*/is_binary_schema, &schema_contents)) {
      Error("unable to load schema: " + options.annotate_schema);
    }

    const uint8_t *binary_schema = nullptr;
    uint64_t binary_schema_size = 0;

    IDLOptions binary_opts;
    binary_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
    Parser parser(binary_opts);

    if (is_binary_schema) {
      binary_schema =
          reinterpret_cast<const uint8_t *>(schema_contents.c_str());
      binary_schema_size = schema_contents.size();
    } else {
      // If we need to generate the .bfbs file from the provided schema file
      // (.fbs)
      ParseFile(parser, options.annotate_schema, schema_contents,
                options.include_directories);
      parser.Serialize();

      binary_schema = parser.builder_.GetBufferPointer();
      binary_schema_size = parser.builder_.GetSize();
    }

    if (binary_schema == nullptr || !binary_schema_size) {
      Error("could not parse a value binary schema from: " +
            options.annotate_schema);
    }

    // Annotate the provided files with the binary_schema.
    AnnotateBinaries(binary_schema, binary_schema_size, options);

    // We don't support doing anything else after annotating a binary.
    return 0;
  }

  if (options.generators.empty() && options.conform_to_schema.empty()) {
    Error("No generator registered");
    return -1;
  }

  std::unique_ptr<Parser> parser = GenerateCode(options, conform_parser);

  for (const auto &code_generator : options.generators) {
    if (code_generator->SupportsRootFileGeneration()) {
      code_generator->GenerateRootFile(*parser, options.output_path);
    }
  }

  return 0;
}